

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::SimpleTypeHandler<2UL>::GetPropertyEquivalenceInfo
          (SimpleTypeHandler<2UL> *this,PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info
          )

{
  bool bVar1;
  PropertyIndex PVar2;
  BOOL BVar3;
  undefined8 in_RAX;
  ushort local_22 [4];
  PropertyIndex index;
  
  local_22[0] = (ushort)((ulong)in_RAX >> 0x30);
  BVar3 = GetDescriptor(this,propertyRecord->pid,local_22);
  if ((BVar3 == 0) || ((this->descriptors[local_22[0]].field_1.Attributes & 8) != 0)) {
    info->slotIndex = 0xffff;
    info->isWritable = true;
    bVar1 = false;
  }
  else {
    PVar2 = DynamicTypeHandler::AdjustSlotIndexForInlineSlots
                      (&this->super_DynamicTypeHandler,local_22[0]);
    info->slotIndex = PVar2;
    info->isWritable = (bool)(this->descriptors[local_22[0]].field_1.Attributes >> 2 & 1);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool SimpleTypeHandler<size>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyRecord->GetPropertyId(), &index) && !(descriptors[index].Attributes & PropertyDeleted))
        {
            info.slotIndex = AdjustSlotIndexForInlineSlots((PropertyIndex)index);
            info.isWritable = !!(descriptors[index].Attributes & PropertyWritable);
            return true;
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isWritable = true;
            return false;
        }
    }